

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

void __thiscall
wasm::ZeroInitSmallVector<unsigned_int,_1UL>::resize
          (ZeroInitSmallVector<unsigned_int,_1UL> *this,size_t newSize)

{
  size_t sVar1;
  uint *puVar2;
  undefined8 local_28;
  size_t i;
  size_t oldSize;
  size_t newSize_local;
  ZeroInitSmallVector<unsigned_int,_1UL> *this_local;
  
  local_28 = SmallVector<unsigned_int,_1UL>::size(&this->super_SmallVector<unsigned_int,_1UL>);
  SmallVector<unsigned_int,_1UL>::resize(&this->super_SmallVector<unsigned_int,_1UL>,newSize);
  while( true ) {
    sVar1 = SmallVector<unsigned_int,_1UL>::size(&this->super_SmallVector<unsigned_int,_1UL>);
    if (sVar1 <= local_28) break;
    puVar2 = operator[](this,local_28);
    *puVar2 = 0;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void resize(size_t newSize) {
    auto oldSize = this->size();
    SmallVector<T, N>::resize(newSize);
    for (size_t i = oldSize; i < this->size(); i++) {
      (*this)[i] = 0;
    }
  }